

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompositeATN.hpp
# Opt level: O0

int __thiscall
Centaurus::CATNMachine<wchar_t>::add_node
          (CATNMachine<wchar_t> *this,CharClass<wchar_t> *cc,int origin,int tag)

{
  bool bVar1;
  reference this_00;
  size_type sVar2;
  int tag_local;
  int origin_local;
  CharClass<wchar_t> *cc_local;
  CATNMachine<wchar_t> *this_local;
  
  bVar1 = std::vector<Centaurus::CATNNode<wchar_t>,_std::allocator<Centaurus::CATNNode<wchar_t>_>_>
          ::empty(&this->m_nodes);
  if ((!bVar1) && (-1 < origin)) {
    this_00 = std::
              vector<Centaurus::CATNNode<wchar_t>,_std::allocator<Centaurus::CATNNode<wchar_t>_>_>::
              operator[](&this->m_nodes,(long)origin);
    sVar2 = std::
            vector<Centaurus::CATNNode<wchar_t>,_std::allocator<Centaurus::CATNNode<wchar_t>_>_>::
            size(&this->m_nodes);
    CATNNode<wchar_t>::add_transition(this_00,cc,(int)sVar2,tag);
  }
  std::vector<Centaurus::CATNNode<wchar_t>,_std::allocator<Centaurus::CATNNode<wchar_t>_>_>::
  emplace_back<>(&this->m_nodes);
  sVar2 = std::vector<Centaurus::CATNNode<wchar_t>,_std::allocator<Centaurus::CATNNode<wchar_t>_>_>
          ::size(&this->m_nodes);
  return (int)sVar2 + -1;
}

Assistant:

int add_node(const CharClass<TCHAR>& cc, int origin, int tag)
    {
        if (!m_nodes.empty() && origin >= 0)
            m_nodes[origin].add_transition(cc, m_nodes.size(), tag);
        m_nodes.emplace_back();
        return m_nodes.size() - 1;
    }